

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
          (SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> *this,FileInfo *Elt)

{
  uint uVar1;
  long lVar2;
  uint64_t *puVar3;
  byte bVar4;
  
  bVar4 = 0;
  uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).super_SmallVectorBase.
      Capacity <= uVar1) {
    grow(this,0);
    uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
            super_SmallVectorBase.Size;
  }
  puVar3 = (uint64_t *)
           ((ulong)uVar1 * 0x50 +
           (long)(this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
                 super_SmallVectorBase.BeginX);
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar3 = Elt->device;
    Elt = (FileInfo *)((long)Elt + (ulong)bVar4 * -0x10 + 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
                    super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }